

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  mapped_type *pmVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  cmValue cVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *installType;
  _Alloc_hider _Var7;
  cmCPackComponent *component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  string macroPrefix;
  cmCPackComponent *child;
  mapped_type *local_a0;
  string local_98;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::count(&this->Components,name);
  local_a0 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::operator[](&this->Components,name);
  if (sVar5 == 0) {
    cmsys::SystemTools::UpperCase(&local_98,name);
    std::operator+(&local_70,"CPACK_COMPONENT_",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::_M_assign((string *)local_a0);
    std::operator+(&local_98,&local_70,"_DISPLAY_NAME");
    GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::_M_assign((string *)&local_a0->DisplayName);
    std::operator+(&local_98,&local_70,"_HIDDEN");
    bVar3 = IsOn(this,&local_98);
    local_a0->field_0x48 = local_a0->field_0x48 & 0xfd | bVar3 * '\x02';
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_70,"_REQUIRED");
    bVar3 = IsOn(this,&local_98);
    local_a0->field_0x48 = local_a0->field_0x48 & 0xfe | bVar3;
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_70,"_DISABLED");
    bVar3 = IsOn(this,&local_98);
    local_a0->field_0x48 = local_a0->field_0x48 & 0xfb | bVar3 << 2;
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_70,"_DOWNLOADED");
    bVar3 = IsOn(this,&local_98);
    if (bVar3) {
      local_a0->field_0x48 = local_a0->field_0x48 | 8;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"CPACK_DOWNLOAD_ALL",&local_71);
      GetOption(this,&local_50);
      bVar3 = cmIsOn((cmValue)0x15c2ca);
      local_a0->field_0x48 = local_a0->field_0x48 & 0xf7 | bVar3 << 3;
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_70,"_ARCHIVE_FILE");
    cVar6 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_a0->ArchiveFile);
    }
    std::operator+(&local_98,&local_70,"_PLIST");
    cVar6 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_a0->Plist);
    }
    std::operator+(&local_98,&local_70,"_GROUP");
    cVar6 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((cVar6.Value == (string *)0x0) || ((cVar6.Value)->_M_string_length == 0)) {
      local_a0->Group = (cmCPackComponentGroup *)0x0;
    }
    else {
      iVar4 = (*this->_vptr_cmCPackGenerator[0x1c])(this,projectName,cVar6.Value);
      local_a0->Group = (cmCPackComponentGroup *)CONCAT44(extraout_var,iVar4);
      std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                (&((cmCPackComponentGroup *)CONCAT44(extraout_var,iVar4))->Components,&local_a0);
    }
    std::operator+(&local_98,&local_70,"_DESCRIPTION");
    cVar6 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_a0->Description);
    }
    std::operator+(&local_98,&local_70,"_INSTALL_TYPES");
    cVar6 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,cVar6,false);
      sVar2 = local_98._M_string_length;
      for (_Var7._M_p = local_98._M_dataplus._M_p; pmVar1 = local_a0, _Var7._M_p != (pointer)sVar2;
          _Var7._M_p = _Var7._M_p + 0x20) {
        iVar4 = (*this->_vptr_cmCPackGenerator[0x1a])(this,projectName,_Var7._M_p);
        local_50._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar4);
        std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
        emplace_back<cmCPackInstallationType*>
                  ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                   &pmVar1->InstallationTypes,(cmCPackInstallationType **)&local_50);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
    }
    std::operator+(&local_98,&local_70,"_DEPENDS");
    cVar6 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,cVar6,false);
      for (; local_98._M_dataplus._M_p != (pointer)local_98._M_string_length;
          local_98._M_dataplus._M_p = local_98._M_dataplus._M_p + 0x20) {
        iVar4 = (*this->_vptr_cmCPackGenerator[0x1b])(this,projectName,local_98._M_dataplus._M_p);
        local_50._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar4);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  (&local_a0->Dependencies,(value_type *)&local_50);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                   (local_50._M_dataplus._M_p + 0xe0),&local_a0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return local_a0;
}

Assistant:

cmCPackComponent* cmCPackGenerator::GetComponent(
  const std::string& projectName, const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent* component = &this->Components[name];
  if (!hasComponent) {
    // Define the component
    std::string macroPrefix =
      "CPACK_COMPONENT_" + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    cmValue displayName = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (cmNonempty(displayName)) {
      component->DisplayName = *displayName;
    } else {
      component->DisplayName = component->Name;
    }
    component->IsHidden = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded = this->IsOn(macroPrefix + "_DOWNLOADED") ||
      cmIsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    cmValue archiveFile = this->GetOption(macroPrefix + "_ARCHIVE_FILE");
    if (cmNonempty(archiveFile)) {
      component->ArchiveFile = *archiveFile;
    }

    cmValue plist = this->GetOption(macroPrefix + "_PLIST");
    if (cmNonempty(plist)) {
      component->Plist = *plist;
    }

    cmValue groupName = this->GetOption(macroPrefix + "_GROUP");
    if (cmNonempty(groupName)) {
      component->Group = this->GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
    } else {
      component->Group = nullptr;
    }

    cmValue description = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (cmNonempty(description)) {
      component->Description = *description;
    }

    // Determine the installation types.
    cmValue installTypes = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (cmNonempty(installTypes)) {
      std::vector<std::string> installTypesVector =
        cmExpandedList(installTypes);
      for (std::string const& installType : installTypesVector) {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, installType));
      }
    }

    // Determine the component dependencies.
    cmValue depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (cmNonempty(depends)) {
      std::vector<std::string> dependsVector = cmExpandedList(depends);
      for (std::string const& depend : dependsVector) {
        cmCPackComponent* child = this->GetComponent(projectName, depend);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
      }
    }
  }
  return component;
}